

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void MListRemove(Col_Word *nodePtr,size_t first,size_t last)

{
  size_t sVar1;
  Col_Word CVar2;
  Col_Word right;
  size_t local_90;
  size_t local_78;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  MergeListChunksInfo info;
  Col_Word *elements;
  size_t leftLength;
  Col_Word CStack_30;
  int type;
  Col_Word node;
  size_t length;
  size_t last_local;
  size_t first_local;
  Col_Word *nodePtr_local;
  
  sVar1 = Col_ListLength(*nodePtr);
  if ((first == 0) && (last == sVar1 - 1)) {
    *nodePtr = 0x14;
  }
  else {
    while( true ) {
      while( true ) {
        if (*nodePtr == 0) {
          local_5c = 0;
        }
        else {
          if ((*nodePtr & 0xf) == 0) {
            if ((*(byte *)*nodePtr & 2) == 0) {
              local_64 = 0xffffffff;
            }
            else {
              local_64 = *(byte *)*nodePtr & 0xfffffffe;
            }
            local_60 = local_64;
          }
          else {
            local_60 = immediateWordTypes[*nodePtr & 0x1f];
          }
          local_5c = local_60;
        }
        if (local_5c == 0xfffffff9) {
          *nodePtr = (sVar1 - ((last - first) + 1)) * 0x20 | 0x14;
          return;
        }
        if (local_5c == 0x1a) {
          if (last < sVar1 - 1) {
            info.vector = *nodePtr + 0x10;
            memmove((void *)(info.vector + first * 8),(void *)(info.vector + last * 8 + 8),
                    ((sVar1 - last) + -1) * 8);
          }
          Col_MVectorSetLength(*nodePtr,sVar1 - ((last - first) + 1));
          return;
        }
        if (local_5c == 0x26) {
          elements = (Col_Word *)(ulong)*(ushort *)(*nodePtr + 2);
          if (elements == (Col_Word *)0x0) {
            elements = (Col_Word *)Col_ListLength(*(Col_Word *)(*nodePtr + 0x10));
          }
          if (elements <= last) {
            if (first < elements) {
              local_78 = 0;
            }
            else {
              local_78 = first - (long)elements;
            }
            MListRemove((Col_Word *)(*nodePtr + 0x18),local_78,last - (long)elements);
          }
          if (first < elements) {
            local_90 = last;
            if (elements <= last) {
              local_90 = (long)elements - 1;
            }
            MListRemove((Col_Word *)(*nodePtr + 0x10),first,local_90);
            elements = (Col_Word *)Col_ListLength(*(Col_Word *)(*nodePtr + 0x10));
          }
          if (elements == (Col_Word *)0x0) {
            *nodePtr = *(Col_Word *)(*nodePtr + 0x18);
            return;
          }
          sVar1 = Col_ListLength(*(Col_Word *)(*nodePtr + 0x18));
          if (sVar1 == 0) {
            *nodePtr = *(Col_Word *)(*nodePtr + 0x10);
            return;
          }
          UpdateMConcatNode(*nodePtr);
          return;
        }
        if (sVar1 - ((last - first) + 1) < 0x27) {
          CVar2 = Col_NewMVector(0,sVar1 - ((last - first) + 1),(Col_Word *)0x0);
          local_58 = 0;
          info.length = CVar2;
          Col_TraverseListChunks(*nodePtr,0,first,0,MergeListChunksProc,&local_58,(size_t *)0x0);
          Col_TraverseListChunks
                    (*nodePtr,last + 1,sVar1 - last,0,MergeListChunksProc,&local_58,(size_t *)0x0);
          *nodePtr = CVar2;
          return;
        }
        if (local_5c == 0x1e) break;
        if (local_5c != 0x22) goto LAB_0011bb20;
        ConvertToMConcatNode(nodePtr);
      }
      if (*(char *)(*nodePtr + 1) == '\0') break;
      ConvertToMConcatNode(nodePtr);
    }
LAB_0011bb20:
    if (first == 0) {
      CStack_30 = Col_Sublist(*nodePtr,last + 1,sVar1 - 1);
    }
    else if (last < sVar1 - 1) {
      CVar2 = Col_Sublist(*nodePtr,0,first - 1);
      right = Col_Sublist(*nodePtr,last + 1,sVar1 - 1);
      CStack_30 = NewMConcatList(CVar2,right);
    }
    else {
      CStack_30 = Col_Sublist(*nodePtr,0,first - 1);
    }
    *nodePtr = CStack_30;
  }
  return;
}

Assistant:

static void
MListRemove(
    Col_Word * nodePtr, /*!< [in,out] Mutable list node to modify. May be
                             overwritten in the process (e.g. if it gets
                             converted to mutable). */
    size_t first,       /*!< Index of first element in range to remove. */
    size_t last)        /*!< Index of last element in range to remove. */
{
    size_t length = Col_ListLength(*nodePtr);
    Col_Word node;
    int type;

    ASSERT(first <= last);
    ASSERT(last < length);

    if (first == 0 && last == length-1) {
        /*
         * Delete all content.
         */

        *nodePtr = WORD_LIST_EMPTY;
        return;
    }

    /*
     * Entry point for tail recursive calls.
     */

start:

    /*
     * First alter mutable types.
     */

    type = WORD_TYPE(*nodePtr);
    switch (type) {
    case WORD_TYPE_MCONCATLIST: {
        size_t leftLength = WORD_CONCATLIST_LEFT_LENGTH(*nodePtr);
        if (leftLength == 0) {
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }

        if (last >= leftLength) {
            /*
             * Remove part on right arm.
             */

            MListRemove(&WORD_CONCATLIST_RIGHT(*nodePtr),
                    (first<leftLength?0:first-leftLength), last-leftLength);
        }
        if (first < leftLength) {
            /*
             * Remove part on left arm.
             */

            MListRemove(&WORD_CONCATLIST_LEFT(*nodePtr), first,
                    (last<leftLength?last:leftLength-1));
            leftLength = Col_ListLength(WORD_CONCATLIST_LEFT(*nodePtr));
        }

        if (leftLength == 0) {
            /*
             * Whole left arm removed, replace node by right.
             */

            *nodePtr = WORD_CONCATLIST_RIGHT(*nodePtr);
        } else if (Col_ListLength(WORD_CONCATLIST_RIGHT(*nodePtr))
                == 0) {
            /*
             * Whole right arm removed, replace node by left.
             */

            *nodePtr = WORD_CONCATLIST_LEFT(*nodePtr);
        } else {
            /*
             * Update & rebalance node.
             */

            UpdateMConcatNode(*nodePtr);
        }
        return;
        }

    case WORD_TYPE_MVECTOR:
        if (last < length-1) {
            /*
             * Move trailing elements.
             */

            Col_Word *elements = WORD_VECTOR_ELEMENTS(*nodePtr);
            memmove(elements+first, elements+last+1, (length-last-1)
                    * sizeof(*elements));
        }

        /*
         * Shorten mutable vector, keeping reserved size.
         */

        Col_MVectorSetLength(*nodePtr, length - (last-first+1));
        return;

    case WORD_TYPE_VOIDLIST:
        /*
         * Shorten void list.
         */

        *nodePtr = WORD_VOIDLIST_NEW(length - (last-first+1));
        return;
    }

    if (length - (last-first+1) <= MAX_SHORT_MVECTOR_LENGTH) {
        /*
         * Merge all chunks into one mutable vector for short lists.
         * TODO: geometric growth?
         */

        MergeListChunksInfo info;

        node = Col_NewMVector(0, length - (last-first+1), NULL);

        info.length = 0;
        info.vector = node;
        Col_TraverseListChunks(*nodePtr, 0, first, 0, MergeListChunksProc,
                &info, NULL);
        Col_TraverseListChunks(*nodePtr, last+1, length-last, 0,
                MergeListChunksProc, &info, NULL);
        ASSERT(info.length == length-(last-first+1));

        *nodePtr = node;
        return;
    }

    /*
     * General case with immutable types.
     */

    switch (type) {
    case WORD_TYPE_CONCATLIST:
        /*
         * Convert to mutable concat then retry.
         */

        ConvertToMConcatNode(nodePtr);
        goto start;

    case WORD_TYPE_SUBLIST:
        if (WORD_SUBLIST_DEPTH(*nodePtr) >= 1) {
            /*
             * Source is concat. Convert to mutable concat then retry.
             */

            ConvertToMConcatNode(nodePtr);
            goto start;
        }
        /* continued. */
    default:
        if (first == 0) {
            /*
             * Remove head: keep tail.
             */

            node = Col_Sublist(*nodePtr, last+1, length-1);
        } else if (last >= length-1) {
            /*
             * Remove tail: keep head.
             */

            node = Col_Sublist(*nodePtr, 0, first-1);
        } else {
            /*
             * Merge head & tail into a mutable concat.
             */

            node = NewMConcatList(Col_Sublist(*nodePtr, 0, first-1),
                    Col_Sublist(*nodePtr, last+1, length-1));
        }
        *nodePtr = node;
        return;
    }
}